

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams1SizeT::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__lhs;
  int i;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = *(char **)((long)this + 8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,": ",&local_81);
  ::std::operator+(&local_60,__lhs,&local_40);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_80,(string_util *)(ulong)*(uint *)((long)this + 0x10),i);
  ::std::operator+(__return_storage_ptr__,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    return name_ + std::string(": ") +
           bssl::string_util::NumberToDecimalString(value_);
  }